

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

string * __thiscall
duckdb::FSSTPrimitives::DecompressValue_abi_cxx11_
          (string *__return_storage_ptr__,FSSTPrimitives *this,void *duckdb_fsst_decoder,
          char *compressed_string,idx_t compressed_string_len,
          vector<unsigned_char,_true> *decompress_buffer)

{
  long lVar1;
  size_t sVar2;
  
  sVar2 = duckdb_fsst_decompress
                    ((duckdb_fsst_decoder_t *)this,(size_t)compressed_string,
                     (uchar *)duckdb_fsst_decoder,
                     *(long *)(compressed_string_len + 8) - (long)*(uchar **)compressed_string_len,
                     *(uchar **)compressed_string_len);
  lVar1 = *(long *)compressed_string_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar1,sVar2 + lVar1);
  return __return_storage_ptr__;
}

Assistant:

string FSSTPrimitives::DecompressValue(void *duckdb_fsst_decoder, const char *compressed_string,
                                       const idx_t compressed_string_len, vector<unsigned char> &decompress_buffer) {
	auto compressed_string_ptr = reinterpret_cast<const unsigned char *>(compressed_string);
	auto fsst_decoder = static_cast<duckdb_fsst_decoder_t *>(duckdb_fsst_decoder);
	auto decompressed_string_size = duckdb_fsst_decompress(fsst_decoder, compressed_string_len, compressed_string_ptr,
	                                                       decompress_buffer.size(), decompress_buffer.data());

	D_ASSERT(!decompress_buffer.empty());
	D_ASSERT(decompressed_string_size <= decompress_buffer.size() - 1);
	return string(char_ptr_cast(decompress_buffer.data()), decompressed_string_size);
}